

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

void __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
insert_graph<boost::adjacency_list<boost::setS,boost::vecS,boost::bidirectionalS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>>
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,
          adjacency_list<boost::setS,_boost::vecS,_boost::bidirectionalS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>
          *skel_graph)

{
  Dictionary *this_00;
  int iVar1;
  stored_size_type sVar2;
  pointer psVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  __buckets_ptr pp_Var6;
  size_t sVar7;
  __node_base_ptr p_Var8;
  invalid_argument *this_01;
  pointer ppVar9;
  pointer psVar10;
  AdjList *g;
  long lVar11;
  adjacency_list<boost::setS,_boost::vecS,_boost::bidirectionalS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>
  *paVar12;
  pointer psVar13;
  Dictionary_it sh;
  transformed_range<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_const_std::pair<boost::range_detail::integer_iterator<unsigned_long>,_boost::range_detail::integer_iterator<unsigned_long>_>_>
  verts;
  undefined1 local_f8 [16];
  dummy_u local_e8;
  undefined4 local_d4;
  undefined1 local_d0 [16];
  dummy_u local_c0;
  Siblings *local_b0;
  __buckets_ptr local_a8;
  __node_base_ptr local_a0;
  transformed_range<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_const_std::pair<boost::range_detail::integer_iterator<unsigned_long>,_boost::range_detail::integer_iterator<unsigned_long>_>_>
  local_98;
  type local_58;
  stored_size_type sStack_50;
  type local_48;
  pointer pvStack_40;
  
  local_b0 = &this->root_;
  sVar7 = num_simplices(this,local_b0);
  if (sVar7 != 0) {
    __assert_fail("num_simplices() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/include/gudhi/Simplex_tree.h"
                  ,0x5d5,
                  "void Gudhi::Simplex_tree<>::insert_graph(const OneSkeletonGraph &) [SimplexTreeOptions = Gudhi::Simplex_tree_options_default, OneSkeletonGraph = boost::adjacency_list<boost::setS, boost::vecS, boost::bidirectionalS, boost::property<Gudhi::vertex_filtration_t, double>, boost::property<Gudhi::edge_filtration_t, double>>]"
                 );
  }
  lVar11 = (long)(skel_graph->super_type).m_vertices.
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::bidirectionalS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::bidirectionalS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::bidirectionalS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::bidirectionalS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(skel_graph->super_type).m_vertices.
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::bidirectionalS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::bidirectionalS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::bidirectionalS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::bidirectionalS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar11 != 0) {
    this->dimension_ =
         (uint)((skel_graph->super_type).m_edges.
                super__List_base<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>_>
                ._M_impl._M_node._M_size != 0);
    this_00 = &(this->root_).members_;
    if ((this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_capacity <
        (ulong)((lVar11 >> 4) * 0x6db6db6db6db6db7)) {
      boost::container::
      vector<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_void>
      ::priv_reserve_no_capacity
                ((vector<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_void>
                  *)this_00);
    }
    local_d0._8_8_ =
         ((long)(skel_graph->super_type).m_vertices.
                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::bidirectionalS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::bidirectionalS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::bidirectionalS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::bidirectionalS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(skel_graph->super_type).m_vertices.
                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::bidirectionalS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::bidirectionalS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::bidirectionalS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::bidirectionalS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
    local_d0._0_8_ = 0;
    local_f8[0] = true;
    local_f8._8_8_ = this;
    local_e8.aligner_ = (type)skel_graph;
    boost::range_detail::
    transformed_range<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/include/gudhi/Simplex_tree.h:1509:70),_const_std::pair<boost::range_detail::integer_iterator<unsigned_long>,_boost::range_detail::integer_iterator<unsigned_long>_>_>
    ::transformed_range(&local_98,(transform_fn_type *)local_f8,
                        (pair<boost::range_detail::integer_iterator<unsigned_long>,_boost::range_detail::integer_iterator<unsigned_long>_>
                         *)local_d0);
    uVar5 = local_d0._8_8_;
    uVar4 = local_f8._8_8_;
    if (local_98.
        super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
        .
        super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
        .
        super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
        .
        super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin.m_f.m_impl.super_type.m_initialized == true) {
      local_48 = local_98.
                 super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
                 .
                 super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                 .
                 super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                 .
                 super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                 .m_Begin.m_f.m_impl.super_type.m_storage.dummy_.aligner_;
      pvStack_40 = (pointer)local_98.
                            super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
                            .
                            super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                            .
                            super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                            .
                            super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                            .m_Begin.m_f.m_impl.super_type.m_storage.dummy_._8_8_;
    }
    if (local_98.
        super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
        .
        super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
        .
        super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
        .
        super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
        .m_End.m_f.m_impl.super_type.m_initialized == true) {
      local_58 = local_98.
                 super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
                 .
                 super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                 .
                 super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                 .
                 super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                 .m_End.m_f.m_impl.super_type.m_storage.dummy_.aligner_;
      sStack_50 = local_98.
                  super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
                  .
                  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                  .
                  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                  .
                  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                  .m_End.m_f.m_impl.super_type.m_storage.dummy_._8_8_;
    }
    local_f8._0_8_ =
         local_98.
         super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
         .
         super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
         .
         super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
         .
         super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
         .m_Begin.super_type.m_iterator.m_value;
    local_f8._8_8_ = local_f8._8_8_ & 0xffffffffffffff00;
    if (local_98.
        super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
        .
        super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
        .
        super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
        .
        super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin.m_f.m_impl.super_type.m_initialized != false) {
      local_e8._0_8_ = local_48;
      local_e8._8_8_ = pvStack_40;
      local_f8._9_7_ = SUB87(uVar4,1);
      local_f8[8] = 1;
    }
    local_d0._0_8_ =
         local_98.
         super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
         .
         super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
         .
         super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
         .
         super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
         .m_End.super_type.m_iterator.m_value;
    local_d0._8_8_ = local_d0._8_8_ & 0xffffffffffffff00;
    if (local_98.
        super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
        .
        super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
        .
        super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
        .
        super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
        .m_End.m_f.m_impl.super_type.m_initialized != false) {
      local_c0.aligner_ = local_58;
      local_c0._8_8_ = sStack_50;
      local_d0._9_7_ = SUB87(uVar5,1);
      local_d0[8] = 1;
    }
    boost::container::dtl::
    flat_tree<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>,boost::container::dtl::select1st<int>,std::less<int>,boost::container::new_allocator<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>>>
    ::
    insert_unique<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::insert_graph<boost::adjacency_list<boost::setS,boost::vecS,boost::bidirectionalS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>>(boost::adjacency_list<boost::setS,boost::vecS,boost::bidirectionalS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>const&)::_lambda(auto:1)_1_,std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>>,boost::range_detail::integer_iterator<unsigned_long>,boost::use_default,boost::use_default>>
              ((flat_tree<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>,boost::container::dtl::select1st<int>,std::less<int>,boost::container::new_allocator<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>>>
                *)this_00,
               (transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>
                *)local_f8,
               (transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>
                *)local_d0);
    if ((bool)local_d0[8] == true) {
      local_d0._8_8_ = local_d0._8_8_ & 0xffffffffffffff00;
    }
    if (local_f8[8] == '\x01') {
      local_f8._8_8_ = local_f8._8_8_ & 0xffffffffffffff00;
    }
    sVar2 = (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size;
    if (sVar2 != 0) {
      ppVar9 = (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_start;
      lVar11 = sVar2 << 5;
      do {
        if (ppVar9 == (pointer)0x0) {
          __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x9b,
                        "vec_iterator<Pointer, IsConst> boost::container::vec_iterator<std::pair<int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<>>> *, false>::operator++(int) [Pointer = std::pair<int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<>>> *, IsConst = false]"
                       );
        }
        ppVar9 = ppVar9 + 1;
        lVar11 = lVar11 + -0x20;
      } while (lVar11 != 0);
    }
    paVar12 = (adjacency_list<boost::setS,_boost::vecS,_boost::bidirectionalS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>
               *)(skel_graph->super_type).m_edges.
                 super__List_base<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
    if (paVar12 != skel_graph) {
      do {
        psVar13 = (pointer)(paVar12->super_type).m_edges.
                           super__List_base<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>_>
                           ._M_impl._M_node._M_size;
        psVar3 = (paVar12->super_type).m_vertices.
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::bidirectionalS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::bidirectionalS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::bidirectionalS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::bidirectionalS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (psVar13 == psVar3) {
          this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(this_01,"Self-loops are not simplicial");
          __cxa_throw(this_01,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        psVar10 = psVar13;
        if (psVar13 >= psVar3 && psVar13 != psVar3) {
          psVar10 = psVar3;
        }
        if (psVar13 < psVar3) {
          psVar13 = psVar3;
        }
        local_f8._0_4_ = (int)psVar10;
        boost::container::dtl::
        flat_tree<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>,_boost::container::dtl::select1st<int>,_std::less<int>,_boost::container::new_allocator<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>_>
        ::find((flat_tree<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>,_boost::container::dtl::select1st<int>,_std::less<int>,_boost::container::new_allocator<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>_>
                *)&stack0xffffffffffffffc8,(key_type *)this_00);
        _to_node_it((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&local_a8,
                    (Simplex_handle *)this);
        pp_Var6 = local_a8;
        if (*(int *)&local_a8[3][1]._M_nxt != *(int *)local_a8) {
          p_Var8 = (__node_base_ptr)operator_new(0x28);
          iVar1 = *(int *)pp_Var6;
          p_Var8->_M_nxt = (_Hash_node_base *)local_b0;
          *(int *)&p_Var8[1]._M_nxt = iVar1;
          p_Var8[2]._M_nxt = (_Hash_node_base *)0x0;
          p_Var8[3]._M_nxt = (_Hash_node_base *)0x0;
          p_Var8[4]._M_nxt = (_Hash_node_base *)0x0;
          pp_Var6[3] = p_Var8;
        }
        local_a0 = pp_Var6[3];
        local_d4 = SUB84(psVar13,0);
        local_d0._0_8_ = 0;
        boost::container::dtl::
        flat_tree<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>,boost::container::dtl::select1st<int>,std::less<int>,boost::container::new_allocator<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>>>
        ::
        try_emplace<int_const&,Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,boost::container::flat_map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>,std::less<int>,void>>*&,double_const&>
                  ((flat_tree<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>,boost::container::dtl::select1st<int>,std::less<int>,boost::container::new_allocator<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>>>
                    *)local_f8,(const_iterator *)(local_a0 + 2),(int *)local_d0,
                   (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
                    **)&local_d4,(double *)&local_a0);
        paVar12 = (adjacency_list<boost::setS,_boost::vecS,_boost::bidirectionalS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>
                   *)(paVar12->super_type).m_edges.
                     super__List_base<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>_>
                     ._M_impl._M_node.super__List_node_base._M_next;
      } while (paVar12 != skel_graph);
    }
  }
  return;
}

Assistant:

void insert_graph(const OneSkeletonGraph& skel_graph) {
    // the simplex tree must be empty
    assert(num_simplices() == 0);

    // is there a better way to let the compiler know that we don't mean Simplex_tree::num_vertices?
    using boost::num_vertices;

    if (num_vertices(skel_graph) == 0) {
      return;
    }
    if (num_edges(skel_graph) == 0) {
      dimension_ = 0;
    } else {
      dimension_ = 1;
    }

    if constexpr (!Options::stable_simplex_handles)
      root_.members_.reserve(num_vertices(skel_graph)); // probably useless in most cases
    auto verts = vertices(skel_graph) | boost::adaptors::transformed([&](auto v){
        return Dit_value_t(v, Node(&root_, get(vertex_filtration_t(), skel_graph, v))); });
    root_.members_.insert(boost::begin(verts), boost::end(verts));
    // This automatically sorts the vertices, the graph concept doesn't guarantee the order in which we iterate.

    for (Dictionary_it it = boost::begin(root_.members_); it != boost::end(root_.members_); it++) {
      update_simplex_tree_after_node_insertion(it);
    }

    std::pair<typename boost::graph_traits<OneSkeletonGraph>::edge_iterator,
              typename boost::graph_traits<OneSkeletonGraph>::edge_iterator> boost_edges = edges(skel_graph);
    // boost_edges.first is the equivalent to boost_edges.begin()
    // boost_edges.second is the equivalent to boost_edges.end()
    for (; boost_edges.first != boost_edges.second; boost_edges.first++) {
      auto edge = *(boost_edges.first);
      auto u = source(edge, skel_graph);
      auto v = target(edge, skel_graph);
      if (u == v) throw std::invalid_argument("Self-loops are not simplicial");
      // We cannot skip edges with the wrong orientation and expect them to
      // come a second time with the right orientation, that does not always
      // happen in practice. emplace() should be a NOP when an element with the
      // same key is already there, so seeing the same edge multiple times is
      // ok.
      // Should we actually forbid multiple edges? That would be consistent
      // with rejecting self-loops.
      if (v < u) std::swap(u, v);
      auto sh = _to_node_it(find_vertex(u));
      if (!has_children(sh)) {
        sh->second.assign_children(new Siblings(&root_, sh->first));
      }

      insert_node_<false, false, false>(sh->second.children(), v, get(edge_filtration_t(), skel_graph, edge));
    }
  }